

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

void __thiscall google::protobuf::io::Tokenizer::NextChar(Tokenizer *this)

{
  int iVar1;
  long lVar2;
  
  if (this->current_char_ == '\t') {
    this->column_ = (this->column_ - this->column_ % 8) + 8;
  }
  else if (this->current_char_ == '\n') {
    this->line_ = this->line_ + 1;
    this->column_ = 0;
  }
  else {
    this->column_ = this->column_ + 1;
  }
  lVar2 = (long)this->buffer_pos_ + 1;
  iVar1 = (int)lVar2;
  this->buffer_pos_ = iVar1;
  if (iVar1 < this->buffer_size_) {
    this->current_char_ = this->buffer_[lVar2];
    return;
  }
  Refresh(this);
  return;
}

Assistant:

void Tokenizer::NextChar() {
  // Update our line and column counters based on the character being
  // consumed.
  if (current_char_ == '\n') {
    ++line_;
    column_ = 0;
  } else if (current_char_ == '\t') {
    column_ += kTabWidth - column_ % kTabWidth;
  } else {
    ++column_;
  }

  // Advance to the next character.
  ++buffer_pos_;
  if (buffer_pos_ < buffer_size_) {
    current_char_ = buffer_[buffer_pos_];
  } else {
    Refresh();
  }
}